

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O1

int ncnn::conv3x3s1_winograd43(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar11;
  ulong uVar9;
  undefined8 uVar10;
  undefined1 auVar12 [32];
  undefined4 uVar13;
  size_t sVar14;
  size_t sVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  void *pvVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  ulong uVar41;
  undefined8 *puVar42;
  undefined8 *puVar43;
  float *pfVar44;
  float *pfVar45;
  int iVar46;
  undefined1 (*pauVar47) [64];
  undefined1 (*pauVar48) [32];
  float *pfVar49;
  long lVar50;
  long lVar51;
  undefined1 (*pauVar52) [64];
  undefined1 (*pauVar53) [16];
  int m_6;
  uint uVar54;
  ulong uVar55;
  uint uVar56;
  int iVar57;
  long lVar58;
  int *piVar59;
  uint uVar60;
  undefined8 unaff_R15;
  long lVar61;
  bool bVar62;
  bool bVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat m;
  Mat m_1;
  float tmp [4] [6] [16];
  Allocator *_allocator;
  int local_8f0;
  uint local_8ec;
  void *local_8e8;
  void *local_8e0;
  int local_8d4;
  long local_8d0;
  ulong local_8c8;
  void *local_8c0;
  long local_8b8;
  ulong local_8b0;
  int local_8a8;
  uint local_8a4;
  Mat local_8a0;
  ulong local_850;
  ulong local_848;
  long local_840;
  Mat *local_838;
  ulong local_830;
  void *local_828;
  ulong local_820;
  long local_818;
  ulong local_810;
  int local_804;
  undefined8 local_800;
  ulong local_7f8;
  ulong local_7f0;
  long local_7e8;
  Mat local_7e0;
  Mat local_790;
  ulong local_748;
  long local_740;
  long local_738;
  int local_72c;
  long local_728;
  long local_720;
  ulong local_718;
  Mat local_710;
  ulong local_6c0;
  Mat *local_6b8;
  void *local_6b0;
  long local_6a8;
  long local_6a0;
  long local_698;
  ulong local_690;
  Mat *local_688;
  Mat local_680;
  float afStack_638 [6];
  undefined8 auStack_620 [6];
  undefined8 auStack_5f0 [2];
  float afStack_5e0 [8];
  undefined8 local_5c0 [12];
  undefined1 auStack_560 [32];
  undefined1 local_540 [64];
  undefined1 auStack_500 [192];
  undefined1 auStack_440 [192];
  undefined1 auStack_380 [384];
  undefined1 auStack_200 [384];
  undefined1 auStack_80 [80];
  
  uVar8 = top_blob->w;
  uVar11 = top_blob->h;
  auVar88._4_4_ = uVar11;
  auVar88._0_4_ = uVar8;
  auVar64._8_4_ = 3;
  auVar64._0_8_ = 0x300000003;
  auVar64._12_4_ = 3;
  auVar88._8_8_ = 0;
  auVar64 = vpaddd_avx512vl(auVar88,auVar64);
  auVar88 = vpsrad_avx(auVar64,0x1f);
  auVar88 = vpsrld_avx(auVar88,0x1e);
  auVar64 = vpaddd_avx(auVar64,auVar88);
  auVar88 = vpsrad_avx(auVar64,2);
  auVar64 = vpshufd_avx(auVar88,0x55);
  auVar64 = vpmulld_avx(auVar64,auVar88);
  uVar60 = top_blob->elempack * top_blob->c;
  iVar29 = auVar64._0_4_;
  uVar56 = bottom_blob->elempack * bottom_blob->c;
  local_838 = top_blob;
  local_6b8 = bias;
  local_688 = AT;
  get_optimal_tile_mnk(uVar60,iVar29,uVar56,(int *)&local_8a4,(int *)&local_8ec,&local_8f0,nT);
  local_804 = (int)(uVar60 + local_8a4 + -1) / (int)local_8a4;
  iVar57 = (int)(iVar29 + local_8ec + -1) / (int)local_8ec;
  iVar20 = (int)(local_8f0 + uVar56 + -1) / local_8f0;
  iVar35 = local_8f0 * local_8ec;
  _allocator = opt->workspace_allocator;
  local_790.cstep = 0;
  local_790.data = (void *)0x0;
  local_790.refcount._0_4_ = 0;
  local_790.refcount._4_4_ = 0;
  local_790.elemsize = 0;
  local_790.elempack = 0;
  local_790.allocator = (Allocator *)0x0;
  local_790.dims = 0;
  local_790.w = 0;
  local_790.h = 0;
  local_790.d = 0;
  local_790.c = 0;
  local_800 = CONCAT44((int)((ulong)unaff_R15 >> 0x20),iVar29);
  local_7f0 = (ulong)uVar56;
  local_6c0 = (ulong)uVar60;
  Mat::create(&local_790,iVar35,0x24,iVar20,iVar57,4,_allocator);
  iVar29 = -100;
  if ((local_790.data == (void *)0x0) || ((long)local_790.c * local_790.cstep == 0))
  goto LAB_001942d5;
  iVar57 = iVar57 * iVar20;
  iVar35 = iVar35 * 0x24;
  if ((nT < 2) || (nT <= iVar57)) {
    local_680.cstep = 0;
    local_680.data = (void *)0x0;
    local_680.refcount._0_4_ = 0;
    local_680.refcount._4_4_ = 0;
    local_680.elemsize = 0;
    local_680.elempack = 0;
    local_680.allocator = (Allocator *)0x0;
    local_680.dims = 0;
    local_680.w = 0;
    local_680.h = 0;
    local_680.d = 0;
    local_680.c = 0;
    Mat::create(&local_680,iVar35,1,nT,4,opt->workspace_allocator);
    bVar62 = local_680.data == (void *)0x0;
    bVar63 = (long)local_680.c * local_680.cstep == 0;
    if (!bVar62 && !bVar63) {
      if (0 < iVar57) {
        iVar35 = 0;
        do {
          iVar46 = local_8ec * (iVar35 / iVar20);
          iVar29 = local_8f0 * (iVar35 % iVar20);
          uVar56 = (int)local_800 - iVar46;
          if ((int)local_8ec < (int)uVar56) {
            uVar56 = local_8ec;
          }
          iVar36 = (int)local_7f0 - iVar29;
          if (local_8f0 < iVar36) {
            iVar36 = local_8f0;
          }
          iVar21 = get_omp_thread_num();
          local_8a0.data =
               (void *)((long)iVar21 * local_680.cstep * local_680.elemsize + (long)local_680.data);
          local_8a0.refcount._0_4_ = 0;
          local_8a0.refcount._4_4_ = 0;
          local_8a0.elemsize = local_680.elemsize;
          local_8a0.elempack = local_680.elempack;
          local_8a0.allocator = local_680.allocator;
          local_8a0.w = local_680.w;
          local_8a0.h = local_680.h;
          local_8a0.d = 1;
          local_8a0.c = local_680.d;
          local_8a0.dims = local_680.dims + -1;
          local_8a0.cstep =
               (local_680.elemsize * (long)local_680.h * (long)local_680.w + 0xf &
               0xfffffffffffffff0) / local_680.elemsize;
          if (local_680.dims == 4) {
            local_8a0.cstep = (long)local_680.h * (long)local_680.w;
          }
          conv3x3s1_winograd43_transform_input_tile
                    (bottom_blob,&local_8a0,iVar46,uVar56,iVar29,iVar36,(int)_allocator);
          local_7e0.cstep = (long)local_790.h * (long)local_790.w;
          local_7e0.data =
               (void *)((long)local_790.data +
                       (uint)(iVar35 % iVar20) * local_790.elemsize * local_7e0.cstep +
                       (long)(iVar35 / iVar20) * local_790.cstep * local_790.elemsize);
          local_7e0.refcount._0_4_ = 0;
          local_7e0.refcount._4_4_ = 0;
          local_7e0.elemsize = local_790.elemsize;
          local_7e0.elempack = local_790.elempack;
          local_7e0.allocator = local_790.allocator;
          local_7e0.dims = 2;
          local_7e0.w = local_790.w;
          local_7e0.h = local_790.h;
          local_7e0.d = 1;
          local_7e0.c = 1;
          transpose_pack_B_tile(&local_8a0,&local_7e0,0x24,uVar56,iVar36,(int)local_7e0.cstep);
          piVar59 = (int *)CONCAT44(local_7e0.refcount._4_4_,local_7e0.refcount._0_4_);
          if (piVar59 != (int *)0x0) {
            LOCK();
            *piVar59 = *piVar59 + -1;
            UNLOCK();
            if (*piVar59 == 0) {
              if (local_7e0.allocator == (Allocator *)0x0) {
                if (local_7e0.data != (void *)0x0) {
                  free(local_7e0.data);
                }
              }
              else {
                (*(local_7e0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_7e0.cstep = 0;
          local_7e0.data = (void *)0x0;
          local_7e0.refcount._0_4_ = 0;
          local_7e0.refcount._4_4_ = 0;
          local_7e0.elemsize = 0;
          local_7e0.elempack = 0;
          local_7e0.dims = 0;
          local_7e0.w = 0;
          local_7e0.h = 0;
          local_7e0.d = 0;
          local_7e0.c = 0;
          piVar59 = (int *)CONCAT44(local_8a0.refcount._4_4_,local_8a0.refcount._0_4_);
          if (piVar59 != (int *)0x0) {
            LOCK();
            *piVar59 = *piVar59 + -1;
            UNLOCK();
            if (*piVar59 == 0) {
              if (local_8a0.allocator == (Allocator *)0x0) {
                if (local_8a0.data != (void *)0x0) {
                  free(local_8a0.data);
                }
              }
              else {
                (*(local_8a0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_8a0.cstep = 0;
          local_8a0.data = (void *)0x0;
          local_8a0.refcount._0_4_ = 0;
          local_8a0.refcount._4_4_ = 0;
          local_8a0.elemsize = 0;
          local_8a0.elempack = 0;
          local_8a0.dims = 0;
          local_8a0.w = 0;
          local_8a0.h = 0;
          local_8a0.d = 0;
          local_8a0.c = 0;
          iVar35 = iVar35 + 1;
        } while (iVar57 != iVar35);
      }
      piVar59 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
      iVar29 = -100;
      if (piVar59 != (int *)0x0) {
        LOCK();
        *piVar59 = *piVar59 + -1;
        UNLOCK();
        if (*piVar59 == 0) {
          if (local_680.allocator == (Allocator *)0x0) {
            if (local_680.data != (void *)0x0) {
              free(local_680.data);
            }
          }
          else {
            (*(local_680.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_680.cstep = 0;
      local_680.data = (void *)0x0;
      local_680.refcount._0_4_ = 0;
      local_680.refcount._4_4_ = 0;
      local_680.elemsize = 0;
      local_680.elempack = 0;
      local_680.dims = 0;
      local_680.w = 0;
      local_680.h = 0;
      local_680.d = 0;
      local_680.c = 0;
      if (bVar62 || bVar63) goto LAB_001942d5;
      goto LAB_00191cb5;
    }
    piVar59 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
    if (piVar59 != (int *)0x0) {
      LOCK();
      *piVar59 = *piVar59 + -1;
      UNLOCK();
      if (*piVar59 == 0) {
        if (local_680.allocator == (Allocator *)0x0) goto LAB_00191bdb;
        (*(local_680.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    local_680.cstep = 0;
    local_680.data = (void *)0x0;
    local_680.refcount._0_4_ = 0;
    local_680.refcount._4_4_ = 0;
    local_680.elemsize = 0;
    local_680.elempack = 0;
    local_680.allocator = (Allocator *)0x0;
    local_680.dims = 0;
    local_680.w = 0;
    local_680.h = 0;
    local_680.d = 0;
    local_680.c = 0;
    Mat::create(&local_680,iVar35,4,opt->workspace_allocator);
    bVar62 = local_680.data == (void *)0x0;
    bVar63 = (long)local_680.c * local_680.cstep == 0;
    if (!bVar62 && !bVar63) {
      if (0 < iVar57) {
        iVar35 = 0;
        do {
          iVar29 = local_8ec * (iVar35 / iVar20);
          iVar46 = local_8f0 * (iVar35 % iVar20);
          uVar56 = (int)local_800 - iVar29;
          if ((int)local_8ec < (int)uVar56) {
            uVar56 = local_8ec;
          }
          iVar36 = (int)local_7f0 - iVar46;
          if (local_8f0 < iVar36) {
            iVar36 = local_8f0;
          }
          conv3x3s1_winograd43_transform_input_tile
                    (bottom_blob,&local_680,iVar29,uVar56,iVar46,iVar36,(int)_allocator);
          local_8a0.cstep = (long)local_790.h * (long)local_790.w;
          local_8a0.data =
               (void *)((long)local_790.data +
                       (uint)(iVar35 % iVar20) * local_790.elemsize * local_8a0.cstep +
                       (long)(iVar35 / iVar20) * local_790.cstep * local_790.elemsize);
          local_8a0.refcount._0_4_ = 0;
          local_8a0.refcount._4_4_ = 0;
          local_8a0.elemsize = local_790.elemsize;
          local_8a0.elempack = local_790.elempack;
          local_8a0.allocator = local_790.allocator;
          local_8a0.dims = 2;
          local_8a0.w = local_790.w;
          local_8a0.h = local_790.h;
          local_8a0.d = 1;
          local_8a0.c = 1;
          transpose_pack_B_tile(&local_680,&local_8a0,0x24,uVar56,iVar36,(int)local_8a0.cstep);
          piVar59 = (int *)CONCAT44(local_8a0.refcount._4_4_,local_8a0.refcount._0_4_);
          if (piVar59 != (int *)0x0) {
            LOCK();
            *piVar59 = *piVar59 + -1;
            UNLOCK();
            if (*piVar59 == 0) {
              if (local_8a0.allocator == (Allocator *)0x0) {
                if (local_8a0.data != (void *)0x0) {
                  free(local_8a0.data);
                }
              }
              else {
                (*(local_8a0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_8a0.cstep = 0;
          local_8a0.data = (void *)0x0;
          local_8a0.refcount._0_4_ = 0;
          local_8a0.refcount._4_4_ = 0;
          local_8a0.elemsize = 0;
          local_8a0.elempack = 0;
          local_8a0.dims = 0;
          local_8a0.w = 0;
          local_8a0.h = 0;
          local_8a0.d = 0;
          local_8a0.c = 0;
          iVar35 = iVar35 + 1;
        } while (iVar57 != iVar35);
      }
      piVar59 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
      iVar29 = -100;
      if (piVar59 != (int *)0x0) {
        LOCK();
        *piVar59 = *piVar59 + -1;
        UNLOCK();
        if (*piVar59 == 0) {
          if (local_680.allocator == (Allocator *)0x0) {
            if (local_680.data != (void *)0x0) {
              free(local_680.data);
            }
          }
          else {
            (*(local_680.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_680.cstep = 0;
      local_680.data = (void *)0x0;
      local_680.refcount._0_4_ = 0;
      local_680.refcount._4_4_ = 0;
      local_680.elemsize = 0;
      local_680.elempack = 0;
      local_680.dims = 0;
      local_680.w = 0;
      local_680.h = 0;
      local_680.d = 0;
      local_680.c = 0;
      if (bVar62 || bVar63) goto LAB_001942d5;
LAB_00191cb5:
      local_680.cstep = 0;
      local_680.c = 0;
      local_680.d = 0;
      local_680.h = 0;
      local_680.w = 0;
      local_680.dims = 0;
      local_680.elempack = 0;
      local_680.elemsize = 0;
      local_680.refcount._4_4_ = 0;
      local_680.refcount._0_4_ = 0;
      local_680.data = (void *)0x0;
      iVar29 = -100;
      local_8a0.cstep = 0;
      local_8a0.data = (void *)0x0;
      local_8a0.refcount._0_4_ = 0;
      local_8a0.refcount._4_4_ = 0;
      local_8a0.elemsize = 0;
      local_8a0.elempack = 0;
      local_8a0.allocator = (Allocator *)0x0;
      local_8a0.dims = 0;
      local_8a0.w = 0;
      local_8a0.h = 0;
      local_8a0.d = 0;
      local_8a0.c = 0;
      Mat::create(&local_8a0,local_8ec * local_8a4 * 0x24,1,nT,4,opt->workspace_allocator);
      if ((local_8a0.data != (void *)0x0) && ((long)local_8a0.c * local_8a0.cstep != 0)) {
        if (0 < local_804) {
          local_8a8 = 0;
          do {
            uVar56 = local_8a4;
            iVar35 = get_omp_thread_num();
            local_7e0.data =
                 (void *)((long)iVar35 * local_8a0.cstep * local_8a0.elemsize + (long)local_8a0.data
                         );
            local_7e0.refcount._0_4_ = 0;
            local_7e0.refcount._4_4_ = 0;
            local_7e0.elemsize = local_8a0.elemsize;
            local_7e0.elempack = local_8a0.elempack;
            local_7e0.allocator = local_8a0.allocator;
            local_7e0.w = local_8a0.w;
            local_7e0.h = local_8a0.h;
            local_7e0.d = 1;
            local_7e0.c = local_8a0.d;
            local_7e0.dims = local_8a0.dims + -1;
            local_7e0.cstep =
                 (local_8a0.elemsize * (long)local_8a0.h * (long)local_8a0.w + 0xf &
                 0xfffffffffffffff0) / local_8a0.elemsize;
            if (local_8a0.dims == 4) {
              local_7e0.cstep = (long)local_8a0.h * (long)local_8a0.w;
            }
            uVar28 = uVar56 * local_8a8;
            local_820 = (ulong)uVar28;
            uVar60 = (int)local_6c0 - uVar28;
            if ((int)uVar56 < (int)uVar60) {
              uVar60 = uVar56;
            }
            auVar75 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
            auVar76 = vbroadcastss_avx512f(ZEXT416(0x40000000));
            auVar77 = vbroadcastss_avx512f(ZEXT416(0x403504f3));
            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
            auVar114 = ZEXT3264(auVar71);
            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3fb504f3));
            auVar115 = ZEXT3264(auVar71);
            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar116 = ZEXT3264(auVar71);
            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
            auVar117 = ZEXT3264(auVar71);
            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3eb504f3));
            auVar118 = ZEXT3264(auVar71);
            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x403504f3));
            auVar119 = ZEXT3264(auVar71);
            auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
            auVar120 = ZEXT1664(auVar64);
            auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3fb504f3));
            auVar121 = ZEXT1664(auVar64);
            auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar122 = ZEXT1664(auVar64);
            auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
            auVar123 = ZEXT1664(auVar64);
            auVar109 = ZEXT1664(CONCAT412(0x3eb504f3,CONCAT48(0x3eb504f3,0x3eb504f33eb504f3)));
            auVar110 = ZEXT1664(CONCAT412(0x403504f3,CONCAT48(0x403504f3,0x403504f3403504f3)));
            auVar111 = ZEXT1664(ZEXT816(0x3fb504f33f3504f3));
            auVar112 = ZEXT1664(ZEXT816(0x3eb504f3403504f3));
            auVar113 = ZEXT1664(ZEXT816(0x403504f33eb504f3));
            if (0 < (int)local_800) {
              local_8b8 = (long)(int)uVar28;
              local_690 = (ulong)uVar60;
              local_7e8 = (long)(int)uVar60;
              uVar32 = 0;
              do {
                uVar56 = (int)local_800 - (int)uVar32;
                if ((int)local_8ec < (int)uVar56) {
                  uVar56 = local_8ec;
                }
                uVar55 = (ulong)uVar56;
                auVar78 = vbroadcastss_avx512f(ZEXT416(0x3f3504f3));
                local_8b0 = uVar32;
                local_850 = uVar55;
                if (0 < (int)local_7f0) {
                  iVar35 = 0;
                  do {
                    uVar55 = local_850;
                    iVar20 = (int)local_7f0 - iVar35;
                    if (local_8f0 < iVar20) {
                      iVar20 = local_8f0;
                    }
                    local_680.w = local_688->w;
                    local_680.h = local_688->h;
                    local_680.elemsize = local_688->elemsize;
                    local_680.elempack = local_688->elempack;
                    local_680.allocator = local_688->allocator;
                    local_680.cstep = (long)local_680.h * (long)local_680.w;
                    local_680.data =
                         (void *)((long)local_688->data +
                                 local_680.elemsize * local_680.cstep * (long)(iVar35 / local_8f0) +
                                 (long)(int)((long)((ulong)(uint)((int)local_820 >> 0x1f) << 0x20 |
                                                   local_820 & 0xffffffff) / (long)(int)local_8a4) *
                                 local_688->cstep * local_680.elemsize);
                    local_680.refcount._0_4_ = 0;
                    local_680.refcount._4_4_ = 0;
                    local_680.dims = 2;
                    local_680.d = 1;
                    local_680.c = 1;
                    local_710.cstep = (long)local_790.h * (long)local_790.w;
                    local_710.data =
                         (void *)((long)local_790.data +
                                 local_790.elemsize * local_710.cstep * (long)(iVar35 / local_8f0) +
                                 (long)(int)((long)((ulong)(uint)((int)local_8b0 >> 0x1f) << 0x20 |
                                                   local_8b0 & 0xffffffff) / (long)(int)local_8ec) *
                                 local_790.cstep * local_790.elemsize);
                    local_710.refcount._0_4_ = 0;
                    local_710.refcount._4_4_ = 0;
                    local_710.elemsize = local_790.elemsize;
                    local_710.elempack = local_790.elempack;
                    local_710.allocator = local_790.allocator;
                    local_710.dims = 2;
                    local_710.w = local_790.w;
                    local_710.h = local_790.h;
                    local_710.d = 1;
                    local_710.c = 1;
                    gemm_transB_packed_tile
                              (&local_680,&local_710,&local_7e0,0x24,uVar60,(int)local_850,iVar35,
                               iVar20);
                    piVar59 = (int *)CONCAT44(local_710.refcount._4_4_,local_710.refcount._0_4_);
                    if (piVar59 != (int *)0x0) {
                      LOCK();
                      *piVar59 = *piVar59 + -1;
                      UNLOCK();
                      if (*piVar59 == 0) {
                        if (local_710.allocator == (Allocator *)0x0) {
                          if (local_710.data != (void *)0x0) {
                            free(local_710.data);
                          }
                        }
                        else {
                          (*(local_710.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    local_710.cstep = 0;
                    local_710.data = (void *)0x0;
                    local_710.refcount._0_4_ = 0;
                    local_710.refcount._4_4_ = 0;
                    local_710.elemsize = 0;
                    local_710.elempack = 0;
                    local_710.dims = 0;
                    local_710.w = 0;
                    local_710.h = 0;
                    local_710.d = 0;
                    local_710.c = 0;
                    piVar59 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
                    auVar78 = vbroadcastss_avx512f(ZEXT416(0x3f3504f3));
                    auVar75 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
                    auVar76 = vbroadcastss_avx512f(ZEXT416(0x40000000));
                    auVar77 = vbroadcastss_avx512f(ZEXT416(0x403504f3));
                    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
                    auVar114 = ZEXT3264(auVar71);
                    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3fb504f3));
                    auVar115 = ZEXT3264(auVar71);
                    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                    auVar116 = ZEXT3264(auVar71);
                    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                    auVar117 = ZEXT3264(auVar71);
                    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3eb504f3));
                    auVar118 = ZEXT3264(auVar71);
                    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x403504f3));
                    auVar119 = ZEXT3264(auVar71);
                    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
                    auVar120 = ZEXT1664(auVar64);
                    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3fb504f3));
                    auVar121 = ZEXT1664(auVar64);
                    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                    auVar122 = ZEXT1664(auVar64);
                    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                    auVar123 = ZEXT1664(auVar64);
                    auVar109 = ZEXT1664(CONCAT412(0x3eb504f3,CONCAT48(0x3eb504f3,0x3eb504f33eb504f3)
                                                 ));
                    auVar110 = ZEXT1664(CONCAT412(0x403504f3,CONCAT48(0x403504f3,0x403504f3403504f3)
                                                 ));
                    auVar111 = ZEXT1664(ZEXT816(0x3fb504f33f3504f3));
                    auVar112 = ZEXT1664(ZEXT816(0x3eb504f3403504f3));
                    auVar113 = ZEXT1664(ZEXT816(0x403504f33eb504f3));
                    if (piVar59 != (int *)0x0) {
                      LOCK();
                      *piVar59 = *piVar59 + -1;
                      UNLOCK();
                      if (*piVar59 == 0) {
                        if (local_680.allocator == (Allocator *)0x0) {
                          if (local_680.data != (void *)0x0) {
                            free(local_680.data);
                            auVar113 = ZEXT1664(ZEXT816(0x403504f33eb504f3));
                            auVar112 = ZEXT1664(ZEXT816(0x3eb504f3403504f3));
                            auVar111 = ZEXT1664(ZEXT816(0x3fb504f33f3504f3));
                            auVar110 = ZEXT1664(CONCAT412(0x403504f3,
                                                          CONCAT48(0x403504f3,0x403504f3403504f3)));
                            auVar109 = ZEXT1664(CONCAT412(0x3eb504f3,
                                                          CONCAT48(0x3eb504f3,0x3eb504f33eb504f3)));
                            auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                            auVar123 = ZEXT1664(auVar64);
                            auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar122 = ZEXT1664(auVar64);
                            auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3fb504f3));
                            auVar121 = ZEXT1664(auVar64);
                            auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
                            auVar120 = ZEXT1664(auVar64);
                            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x403504f3));
                            auVar119 = ZEXT3264(auVar71);
                            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3eb504f3));
                            auVar118 = ZEXT3264(auVar71);
                            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                            auVar117 = ZEXT3264(auVar71);
                            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar116 = ZEXT3264(auVar71);
                            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3fb504f3));
                            auVar115 = ZEXT3264(auVar71);
                            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
                            auVar114 = ZEXT3264(auVar71);
                            auVar77 = vbroadcastss_avx512f(ZEXT416(0x403504f3));
                            auVar76 = vbroadcastss_avx512f(ZEXT416(0x40000000));
                            auVar75 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
                            auVar78 = vbroadcastss_avx512f(ZEXT416(0x3f3504f3));
                          }
                        }
                        else {
                          (*(local_680.allocator)->_vptr_Allocator[3])();
                          auVar113 = ZEXT1664(ZEXT816(0x403504f33eb504f3));
                          auVar112 = ZEXT1664(ZEXT816(0x3eb504f3403504f3));
                          auVar111 = ZEXT1664(ZEXT816(0x3fb504f33f3504f3));
                          auVar110 = ZEXT1664(CONCAT412(0x403504f3,
                                                        CONCAT48(0x403504f3,0x403504f3403504f3)));
                          auVar109 = ZEXT1664(CONCAT412(0x3eb504f3,
                                                        CONCAT48(0x3eb504f3,0x3eb504f33eb504f3)));
                          auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                          auVar123 = ZEXT1664(auVar64);
                          auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar122 = ZEXT1664(auVar64);
                          auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3fb504f3));
                          auVar121 = ZEXT1664(auVar64);
                          auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
                          auVar120 = ZEXT1664(auVar64);
                          auVar71 = vbroadcastss_avx512vl(ZEXT416(0x403504f3));
                          auVar119 = ZEXT3264(auVar71);
                          auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3eb504f3));
                          auVar118 = ZEXT3264(auVar71);
                          auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                          auVar117 = ZEXT3264(auVar71);
                          auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar116 = ZEXT3264(auVar71);
                          auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3fb504f3));
                          auVar115 = ZEXT3264(auVar71);
                          auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
                          auVar114 = ZEXT3264(auVar71);
                          auVar77 = vbroadcastss_avx512f(ZEXT416(0x403504f3));
                          auVar76 = vbroadcastss_avx512f(ZEXT416(0x40000000));
                          auVar75 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
                          auVar78 = vbroadcastss_avx512f(ZEXT416(0x3f3504f3));
                        }
                      }
                    }
                    local_680.cstep = 0;
                    local_680.data = (void *)0x0;
                    local_680.refcount._0_4_ = 0;
                    local_680.refcount._4_4_ = 0;
                    local_680.elemsize = 0;
                    local_680.elempack = 0;
                    local_680.dims = 0;
                    local_680.w = 0;
                    local_680.h = 0;
                    local_680.d = 0;
                    local_680.c = 0;
                    iVar35 = iVar35 + local_8f0;
                  } while (iVar35 < (int)local_7f0);
                }
                iVar35 = local_838->w;
                iVar20 = local_838->elempack;
                iVar57 = local_838->h;
                uVar56 = (int)local_838->cstep * iVar20;
                local_7f8 = (ulong)uVar56;
                local_8d4 = iVar35 + 6;
                if (-1 < iVar35 + 3) {
                  local_8d4 = iVar35 + 3;
                }
                local_8d4 = local_8d4 >> 2;
                uVar32 = 0;
                local_8e0 = local_6b8->data;
                iVar46 = (int)local_820;
                iVar29 = (int)local_8b0;
                if (0xf < (int)uVar60) {
                  iVar36 = (int)uVar55;
                  lVar50 = (long)(int)uVar56;
                  local_740 = (long)(int)(uVar56 * 2);
                  lVar61 = (long)(int)(uVar56 * 3);
                  lVar58 = (long)(int)(uVar56 * 4);
                  lVar30 = (long)(int)(uVar56 * 5);
                  lVar22 = (long)(int)(uVar56 * 6);
                  lVar51 = (long)(int)(uVar56 * 8);
                  lVar23 = (long)(int)(uVar56 * 7);
                  lVar24 = (long)(int)(uVar56 * 9);
                  local_8e8 = (void *)(long)(int)(uVar56 * 10);
                  lVar25 = (long)(int)(uVar56 * 0xb);
                  lVar26 = (long)(int)(uVar56 * 0xc);
                  local_8d0 = (long)(int)(uVar56 * 0xd);
                  local_8c0 = (void *)(long)(int)(uVar56 * 0xe);
                  local_8c8 = (ulong)(int)(uVar56 * 0xf);
                  local_830 = (ulong)(iVar20 * iVar35);
                  local_738 = (long)(iVar36 * 0x60) * 4;
                  local_698 = (long)(iVar36 * 0x10) * 4;
                  local_6a0 = (long)(iVar36 * 0x20) * 4;
                  local_720 = (long)(iVar36 * 0x30) * 4;
                  local_72c = iVar36 * 0x240;
                  local_6a8 = (long)(iVar36 * 0x40) * 4;
                  local_728 = (long)(iVar36 * 0x50) * 4;
                  local_6b0 = (void *)((long)local_8e0 + local_8b8 * 4);
                  local_748 = uVar55 & 0xffffffff;
                  local_828 = (void *)0x0;
                  uVar32 = 0;
                  do {
                    local_718 = uVar32;
                    if (local_8e0 == (void *)0x0) {
                      auVar79 = ZEXT1664((undefined1  [16])0x0);
                    }
                    else {
                      auVar79 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                   ((long)local_6b0 + local_718 * 4));
                    }
                    if (0 < (int)uVar55) {
                      lVar27 = (long)(int)local_828;
                      local_818 = lVar27 * 4;
                      uVar32 = 0;
                      lVar31 = 0;
                      do {
                        local_840 = lVar31;
                        local_810 = uVar32;
                        iVar36 = iVar29 + (int)local_810;
                        lVar31 = (long)local_7e0.data + local_840;
                        lVar40 = -0x180;
                        auVar80 = vbroadcastss_avx512f(ZEXT416(0x3fb504f3));
                        auVar81 = vbroadcastss_avx512f(ZEXT416(0x3eb504f3));
                        do {
                          auVar84 = *(undefined1 (*) [64])(lVar31 + local_698 + lVar27 * 4);
                          auVar85 = *(undefined1 (*) [64])(lVar31 + local_6a0 + lVar27 * 4);
                          auVar86 = *(undefined1 (*) [64])(lVar31 + local_720 + lVar27 * 4);
                          auVar87 = *(undefined1 (*) [64])(lVar31 + local_6a8 + lVar27 * 4);
                          auVar82 = vaddps_avx512f(auVar85,auVar84);
                          auVar83 = vaddps_avx512f(auVar87,auVar86);
                          auVar84 = vsubps_avx512f(auVar84,auVar85);
                          auVar85 = vsubps_avx512f(auVar86,auVar87);
                          auVar86 = vaddps_avx512f(auVar82,*(undefined1 (*) [64])
                                                            (lVar31 + local_818));
                          auVar86 = vaddps_avx512f(auVar86,auVar83);
                          auVar87 = vmulps_avx512f(auVar84,auVar78);
                          auVar87 = vfmadd231ps_avx512f(auVar87,auVar85,auVar80);
                          auVar82 = vmulps_avx512f(auVar82,auVar75);
                          auVar84 = vfmadd213ps_avx512f(auVar84,auVar81,
                                                        *(undefined1 (*) [64])
                                                         (lVar31 + local_728 + lVar27 * 4));
                          auVar82 = vfmadd231ps_avx512f(auVar82,auVar83,auVar76);
                          auVar84 = vfmadd231ps_avx512f(auVar84,auVar85,auVar77);
                          *(undefined1 (*) [64])(auStack_500 + lVar40) = auVar86;
                          *(undefined1 (*) [64])(auStack_380 + lVar40) = auVar87;
                          *(undefined1 (*) [64])(auStack_200 + lVar40) = auVar82;
                          *(undefined1 (*) [64])(auStack_80 + lVar40) = auVar84;
                          lVar31 = lVar31 + local_738;
                          lVar40 = lVar40 + 0x40;
                        } while (lVar40 != 0);
                        iVar21 = iVar36 % local_8d4;
                        uVar28 = iVar36 / local_8d4 << 2;
                        pauVar52 = (undefined1 (*) [64])
                                   ((long)local_838->data +
                                   (long)(iVar21 * 4 * iVar20) * 4 +
                                   (long)local_838->w * local_838->elemsize * (long)(int)uVar28 +
                                   local_838->cstep * (long)((iVar46 + (int)local_718) / iVar20) *
                                   local_838->elemsize);
                        iVar37 = iVar21 * 4 + 1;
                        iVar38 = iVar21 * 4 + 2;
                        iVar36 = iVar21 * 4 + 3;
                        pauVar47 = &local_540;
                        lVar31 = 0;
                        do {
                          if ((int)(uVar28 | (uint)lVar31) < iVar57) {
                            auVar80 = vaddps_avx512f(pauVar47[-3],pauVar47[-4]);
                            auVar81 = vaddps_avx512f(pauVar47[-1],pauVar47[-2]);
                            auVar84 = vsubps_avx512f(pauVar47[-4],pauVar47[-3]);
                            auVar85 = vsubps_avx512f(pauVar47[-2],pauVar47[-1]);
                            auVar86 = vaddps_avx512f(auVar79,pauVar47[-5]);
                            auVar86 = vaddps_avx512f(auVar86,auVar80);
                            auVar86 = vaddps_avx512f(auVar86,auVar81);
                            auVar87 = vfmadd231ps_avx512f(auVar79,auVar84,auVar78);
                            auVar80 = vfmadd132ps_avx512f(auVar80,auVar79,auVar75);
                            auVar82 = vfmadd231ps_avx512f(auVar80,auVar81,auVar76);
                            auVar83 = vaddps_avx512f(auVar79,*pauVar47);
                            auVar80._8_4_ = 0x3fb504f3;
                            auVar80._0_8_ = 0x3fb504f33fb504f3;
                            auVar80._12_4_ = 0x3fb504f3;
                            auVar80._16_4_ = 0x3fb504f3;
                            auVar80._20_4_ = 0x3fb504f3;
                            auVar80._24_4_ = 0x3fb504f3;
                            auVar80._28_4_ = 0x3fb504f3;
                            auVar80._32_4_ = 0x3fb504f3;
                            auVar80._36_4_ = 0x3fb504f3;
                            auVar80._40_4_ = 0x3fb504f3;
                            auVar80._44_4_ = 0x3fb504f3;
                            auVar80._48_4_ = 0x3fb504f3;
                            auVar80._52_4_ = 0x3fb504f3;
                            auVar80._56_4_ = 0x3fb504f3;
                            auVar80._60_4_ = 0x3fb504f3;
                            auVar80 = vfmadd231ps_avx512f(auVar87,auVar85,auVar80);
                            auVar81._8_4_ = 0x3eb504f3;
                            auVar81._0_8_ = 0x3eb504f33eb504f3;
                            auVar81._12_4_ = 0x3eb504f3;
                            auVar81._16_4_ = 0x3eb504f3;
                            auVar81._20_4_ = 0x3eb504f3;
                            auVar81._24_4_ = 0x3eb504f3;
                            auVar81._28_4_ = 0x3eb504f3;
                            auVar81._32_4_ = 0x3eb504f3;
                            auVar81._36_4_ = 0x3eb504f3;
                            auVar81._40_4_ = 0x3eb504f3;
                            auVar81._44_4_ = 0x3eb504f3;
                            auVar81._48_4_ = 0x3eb504f3;
                            auVar81._52_4_ = 0x3eb504f3;
                            auVar81._56_4_ = 0x3eb504f3;
                            auVar81._60_4_ = 0x3eb504f3;
                            auVar81 = vfmadd231ps_avx512f(auVar83,auVar84,auVar81);
                            auVar81 = vfmadd231ps_avx512f(auVar81,auVar85,auVar77);
                            auVar65 = auVar86._0_16_;
                            auVar66 = auVar80._0_16_;
                            auVar88 = auVar82._0_16_;
                            auVar64 = auVar81._0_16_;
                            if (iVar20 < 8) {
LAB_0019298a:
                              if (iVar20 == 1) {
                                *(int *)*pauVar52 = auVar86._0_4_;
                                uVar13 = vextractps_avx(auVar65,1);
                                *(undefined4 *)(*pauVar52 + lVar50 * 4) = uVar13;
                                uVar13 = vextractps_avx(auVar65,2);
                                *(undefined4 *)(*pauVar52 + local_740 * 4) = uVar13;
                                uVar13 = vextractps_avx(auVar65,3);
                                *(undefined4 *)(*pauVar52 + lVar61 * 4) = uVar13;
                                auVar65 = auVar86._16_16_;
                                *(int *)(*pauVar52 + lVar58 * 4) = auVar86._16_4_;
                                uVar13 = vextractps_avx(auVar65,1);
                                *(undefined4 *)(*pauVar52 + lVar30 * 4) = uVar13;
                                uVar13 = vextractps_avx(auVar65,2);
                                *(undefined4 *)(*pauVar52 + lVar22 * 4) = uVar13;
                                uVar13 = vextractps_avx(auVar65,3);
                                *(undefined4 *)(*pauVar52 + lVar23 * 4) = uVar13;
                                auVar65 = vextracti32x4_avx512f(auVar86,2);
                                *(int *)(*pauVar52 + lVar51 * 4) = auVar65._0_4_;
                                uVar13 = vextractps_avx(auVar65,1);
                                *(undefined4 *)(*pauVar52 + lVar24 * 4) = uVar13;
                                uVar13 = vextractps_avx(auVar65,2);
                                *(undefined4 *)(*pauVar52 + (long)local_8e8 * 4) = uVar13;
                                uVar13 = vextractps_avx(auVar65,3);
                                *(undefined4 *)(*pauVar52 + lVar25 * 4) = uVar13;
                                auVar65 = vextracti32x4_avx512f(auVar86,3);
                                *(int *)(*pauVar52 + lVar26 * 4) = auVar65._0_4_;
                                uVar13 = vextractps_avx(auVar65,1);
                                *(undefined4 *)(*pauVar52 + local_8d0 * 4) = uVar13;
                                uVar13 = vextractps_avx(auVar65,2);
                                *(undefined4 *)(*pauVar52 + (long)local_8c0 * 4) = uVar13;
                                uVar13 = vextractps_avx(auVar65,3);
                                *(undefined4 *)(*pauVar52 + local_8c8 * 4) = uVar13;
                                if (iVar37 < iVar35) {
                                  *(int *)(*pauVar52 + 4) = auVar80._0_4_;
                                  uVar13 = vextractps_avx(auVar66,1);
                                  *(undefined4 *)(*pauVar52 + lVar50 * 4 + 4) = uVar13;
                                  uVar13 = vextractps_avx(auVar66,2);
                                  *(undefined4 *)(*pauVar52 + local_740 * 4 + 4) = uVar13;
                                  uVar13 = vextractps_avx(auVar66,3);
                                  *(undefined4 *)(*pauVar52 + lVar61 * 4 + 4) = uVar13;
                                  auVar66 = auVar80._16_16_;
                                  *(int *)(*pauVar52 + lVar58 * 4 + 4) = auVar80._16_4_;
                                  uVar13 = vextractps_avx(auVar66,1);
                                  *(undefined4 *)(*pauVar52 + lVar30 * 4 + 4) = uVar13;
                                  uVar13 = vextractps_avx(auVar66,2);
                                  *(undefined4 *)(*pauVar52 + lVar22 * 4 + 4) = uVar13;
                                  uVar13 = vextractps_avx(auVar66,3);
                                  *(undefined4 *)(*pauVar52 + lVar23 * 4 + 4) = uVar13;
                                  auVar66 = vextracti32x4_avx512f(auVar80,2);
                                  *(int *)(*pauVar52 + lVar51 * 4 + 4) = auVar66._0_4_;
                                  uVar13 = vextractps_avx(auVar66,1);
                                  *(undefined4 *)(*pauVar52 + lVar24 * 4 + 4) = uVar13;
                                  uVar13 = vextractps_avx(auVar66,2);
                                  *(undefined4 *)(*pauVar52 + (long)local_8e8 * 4 + 4) = uVar13;
                                  uVar13 = vextractps_avx(auVar66,3);
                                  *(undefined4 *)(*pauVar52 + lVar25 * 4 + 4) = uVar13;
                                  auVar66 = vextracti32x4_avx512f(auVar80,3);
                                  *(int *)(*pauVar52 + lVar26 * 4 + 4) = auVar66._0_4_;
                                  uVar13 = vextractps_avx(auVar66,1);
                                  *(undefined4 *)(*pauVar52 + local_8d0 * 4 + 4) = uVar13;
                                  uVar13 = vextractps_avx(auVar66,2);
                                  *(undefined4 *)(*pauVar52 + (long)local_8c0 * 4 + 4) = uVar13;
                                  uVar13 = vextractps_avx(auVar66,3);
                                  *(undefined4 *)(*pauVar52 + local_8c8 * 4 + 4) = uVar13;
                                }
                                if (iVar38 < iVar35) {
                                  *(int *)(*pauVar52 + 8) = auVar82._0_4_;
                                  uVar13 = vextractps_avx(auVar88,1);
                                  *(undefined4 *)(*pauVar52 + lVar50 * 4 + 8) = uVar13;
                                  uVar13 = vextractps_avx(auVar88,2);
                                  *(undefined4 *)(*pauVar52 + local_740 * 4 + 8) = uVar13;
                                  uVar13 = vextractps_avx(auVar88,3);
                                  *(undefined4 *)(*pauVar52 + lVar61 * 4 + 8) = uVar13;
                                  auVar88 = auVar82._16_16_;
                                  *(int *)(*pauVar52 + lVar58 * 4 + 8) = auVar82._16_4_;
                                  uVar13 = vextractps_avx(auVar88,1);
                                  *(undefined4 *)(*pauVar52 + lVar30 * 4 + 8) = uVar13;
                                  uVar13 = vextractps_avx(auVar88,2);
                                  *(undefined4 *)(*pauVar52 + lVar22 * 4 + 8) = uVar13;
                                  uVar13 = vextractps_avx(auVar88,3);
                                  *(undefined4 *)(*pauVar52 + lVar23 * 4 + 8) = uVar13;
                                  auVar88 = vextracti32x4_avx512f(auVar82,2);
                                  *(int *)(*pauVar52 + lVar51 * 4 + 8) = auVar88._0_4_;
                                  uVar13 = vextractps_avx(auVar88,1);
                                  *(undefined4 *)(*pauVar52 + lVar24 * 4 + 8) = uVar13;
                                  uVar13 = vextractps_avx(auVar88,2);
                                  *(undefined4 *)(*pauVar52 + (long)local_8e8 * 4 + 8) = uVar13;
                                  uVar13 = vextractps_avx(auVar88,3);
                                  *(undefined4 *)(*pauVar52 + lVar25 * 4 + 8) = uVar13;
                                  auVar88 = vextracti32x4_avx512f(auVar82,3);
                                  *(int *)(*pauVar52 + lVar26 * 4 + 8) = auVar88._0_4_;
                                  uVar13 = vextractps_avx(auVar88,1);
                                  *(undefined4 *)(*pauVar52 + local_8d0 * 4 + 8) = uVar13;
                                  uVar13 = vextractps_avx(auVar88,2);
                                  *(undefined4 *)(*pauVar52 + (long)local_8c0 * 4 + 8) = uVar13;
                                  uVar13 = vextractps_avx(auVar88,3);
                                  *(undefined4 *)(*pauVar52 + local_8c8 * 4 + 8) = uVar13;
                                }
                                if (iVar36 < iVar35) {
                                  *(int *)(*pauVar52 + 0xc) = auVar81._0_4_;
                                  uVar13 = vextractps_avx(auVar64,1);
                                  *(undefined4 *)(*pauVar52 + lVar50 * 4 + 0xc) = uVar13;
                                  uVar13 = vextractps_avx(auVar64,2);
                                  *(undefined4 *)(*pauVar52 + local_740 * 4 + 0xc) = uVar13;
                                  uVar13 = vextractps_avx(auVar64,3);
                                  *(undefined4 *)(*pauVar52 + lVar61 * 4 + 0xc) = uVar13;
                                  auVar64 = auVar81._16_16_;
                                  *(int *)(*pauVar52 + lVar58 * 4 + 0xc) = auVar81._16_4_;
                                  uVar13 = vextractps_avx(auVar64,1);
                                  *(undefined4 *)(*pauVar52 + lVar30 * 4 + 0xc) = uVar13;
                                  uVar13 = vextractps_avx(auVar64,2);
                                  *(undefined4 *)(*pauVar52 + lVar22 * 4 + 0xc) = uVar13;
                                  uVar13 = vextractps_avx(auVar64,3);
                                  *(undefined4 *)(*pauVar52 + lVar23 * 4 + 0xc) = uVar13;
                                  auVar64 = vextracti32x4_avx512f(auVar81,2);
                                  *(int *)(*pauVar52 + lVar51 * 4 + 0xc) = auVar64._0_4_;
                                  uVar13 = vextractps_avx(auVar64,1);
                                  *(undefined4 *)(*pauVar52 + lVar24 * 4 + 0xc) = uVar13;
                                  uVar13 = vextractps_avx(auVar64,2);
                                  *(undefined4 *)(*pauVar52 + (long)local_8e8 * 4 + 0xc) = uVar13;
                                  uVar13 = vextractps_avx(auVar64,3);
                                  *(undefined4 *)(*pauVar52 + lVar25 * 4 + 0xc) = uVar13;
                                  auVar64 = vextracti32x4_avx512f(auVar81,3);
                                  *(int *)(*pauVar52 + lVar26 * 4 + 0xc) = auVar64._0_4_;
                                  uVar13 = vextractps_avx(auVar64,1);
                                  *(undefined4 *)(*pauVar52 + local_8d0 * 4 + 0xc) = uVar13;
                                  uVar13 = vextractps_avx(auVar64,2);
                                  *(undefined4 *)(*pauVar52 + (long)local_8c0 * 4 + 0xc) = uVar13;
                                  uVar13 = vextractps_avx(auVar64,3);
                                  *(undefined4 *)(*pauVar52 + local_8c8 * 4 + 0xc) = uVar13;
                                }
                              }
                              else if (iVar20 == 4) {
                                *(undefined1 (*) [16])*pauVar52 = auVar65;
                                auVar65 = vextractf32x4_avx512f(auVar86,1);
                                *(undefined1 (*) [16])(*pauVar52 + lVar50 * 4) = auVar65;
                                auVar65 = vextractf32x4_avx512f(auVar86,2);
                                *(undefined1 (*) [16])(*pauVar52 + local_740 * 4) = auVar65;
                                auVar65 = vextractf32x4_avx512f(auVar86,3);
                                *(undefined1 (*) [16])(*pauVar52 + lVar61 * 4) = auVar65;
                                if (iVar37 < iVar35) {
                                  *(undefined1 (*) [16])(*pauVar52 + 0x10) = auVar66;
                                  auVar66 = vextractf32x4_avx512f(auVar80,1);
                                  *(undefined1 (*) [16])(*pauVar52 + lVar50 * 4 + 8) = auVar66;
                                  auVar66 = vextractf32x4_avx512f(auVar80,2);
                                  *(undefined1 (*) [16])(*pauVar52 + local_740 * 4 + 8) = auVar66;
                                  auVar66 = vextractf32x4_avx512f(auVar80,3);
                                  *(undefined1 (*) [16])(*pauVar52 + lVar61 * 4 + 8) = auVar66;
                                }
                                if (iVar38 < iVar35) {
                                  *(undefined1 (*) [16])(*pauVar52 + 0x20) = auVar88;
                                  auVar88 = vextractf32x4_avx512f(auVar82,1);
                                  *(undefined1 (*) [16])(*pauVar52 + lVar50 * 4 + 0x10) = auVar88;
                                  auVar88 = vextractf32x4_avx512f(auVar82,2);
                                  *(undefined1 (*) [16])(*pauVar52 + local_740 * 4 + 0x10) = auVar88
                                  ;
                                  auVar88 = vextractf32x4_avx512f(auVar82,3);
                                  *(undefined1 (*) [16])(*pauVar52 + lVar61 * 4 + 0x10) = auVar88;
                                }
                                if (iVar36 < iVar35) {
                                  *(undefined1 (*) [16])(*pauVar52 + 0x30) = auVar64;
                                  auVar64 = vextractf32x4_avx512f(auVar81,1);
                                  *(undefined1 (*) [16])(*pauVar52 + lVar50 * 4 + 0x18) = auVar64;
                                  auVar64 = vextractf32x4_avx512f(auVar81,2);
                                  *(undefined1 (*) [16])(*pauVar52 + local_740 * 4 + 0x18) = auVar64
                                  ;
                                  auVar64 = vextractf32x4_avx512f(auVar81,3);
                                  *(undefined1 (*) [16])(*pauVar52 + lVar61 * 4 + 0x18) = auVar64;
                                }
                              }
                            }
                            else {
                              if (iVar20 == 8) {
                                *(undefined1 (*) [32])*pauVar52 = auVar86._0_32_;
                                auVar71 = vextractf64x4_avx512f(auVar86,1);
                                *(undefined1 (*) [32])(*pauVar52 + lVar50 * 4) = auVar71;
                                if (iVar37 < iVar35) {
                                  *(undefined1 (*) [32])(*pauVar52 + 0x20) = auVar80._0_32_;
                                  auVar71 = vextractf64x4_avx512f(auVar80,1);
                                  *(undefined1 (*) [32])(*pauVar52 + lVar50 * 4 + 0x10) = auVar71;
                                }
                                if (iVar38 < iVar35) {
                                  *(undefined1 (*) [32])pauVar52[1] = auVar82._0_32_;
                                  auVar71 = vextractf64x4_avx512f(auVar82,1);
                                  *(undefined1 (*) [32])(*pauVar52 + lVar50 * 4 + 0x20) = auVar71;
                                }
                                if (iVar36 < iVar35) {
                                  *(undefined1 (*) [32])(pauVar52[1] + 0x20) = auVar81._0_32_;
                                  auVar71 = vextractf64x4_avx512f(auVar81,1);
                                  *(undefined1 (*) [32])(*pauVar52 + lVar50 * 4 + 0x30) = auVar71;
                                }
                                goto LAB_0019298a;
                              }
                              if (iVar20 == 0x10) {
                                *pauVar52 = auVar86;
                                if (iVar37 < iVar35) {
                                  pauVar52[1] = auVar80;
                                }
                                if (iVar38 < iVar35) {
                                  pauVar52[2] = auVar82;
                                }
                                if (iVar36 < iVar35) {
                                  pauVar52[3] = auVar81;
                                }
                              }
                            }
                            pauVar52 = (undefined1 (*) [64])(*pauVar52 + local_830 * 4);
                          }
                          lVar31 = lVar31 + 1;
                          pauVar47 = pauVar47 + 6;
                        } while (lVar31 != 4);
                        uVar32 = local_810 + 1;
                        lVar31 = local_840 + 0x40;
                      } while (local_810 + 1 != local_748);
                    }
                    uVar32 = local_718 + 0x10;
                    local_828 = (void *)(ulong)(uint)((int)local_828 + local_72c);
                    uVar55 = local_850;
                  } while (local_718 + 0x1f < local_690);
                }
                if ((int)((uint)uVar32 | 7) < (int)uVar60) {
                  iVar36 = (int)uVar55;
                  local_8c0 = (void *)(long)(int)(uVar56 * 2);
                  lVar23 = (long)(int)(uVar56 * 3);
                  lVar24 = (long)(int)(uVar56 * 4);
                  lVar25 = (long)(int)(uVar56 * 5);
                  lVar26 = (long)(int)(uVar56 * 6);
                  lVar30 = (long)(int)(uVar56 * 7);
                  local_840 = CONCAT44(local_840._4_4_,(uint)uVar32 * iVar36 * 0x24);
                  local_8d0 = (long)(iVar36 * 0x30) * 4;
                  local_818 = (long)(iVar36 * 8) * 4;
                  local_738 = (long)(iVar36 * 0x18) * 4;
                  local_810 = CONCAT44(local_810._4_4_,iVar36 * 0x120);
                  local_740 = (long)(iVar36 * 0x20) * 4;
                  local_748 = (long)(iVar36 * 0x28) * 4;
                  local_828 = (void *)((long)local_8e0 + local_8b8 * 4);
                  lVar22 = (long)(int)uVar56;
                  local_8c8 = uVar55 & 0xffffffff;
                  uVar32 = uVar32 & 0xffffffff;
                  do {
                    local_830 = uVar32;
                    if (local_8e0 == (void *)0x0) {
                      auVar71 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                    }
                    else {
                      auVar71 = *(undefined1 (*) [32])((long)local_828 + local_830 * 4);
                    }
                    if (0 < (int)uVar55) {
                      lVar50 = (long)(int)local_840;
                      uVar32 = 0;
                      pvVar34 = (void *)0x0;
                      do {
                        local_8e8 = pvVar34;
                        iVar21 = iVar29 + (int)uVar32;
                        lVar51 = (long)local_7e0.data + (long)local_8e8;
                        lVar58 = -0xc0;
                        do {
                          auVar74 = *(undefined1 (*) [32])(lVar51 + local_818 + lVar50 * 4);
                          auVar12 = *(undefined1 (*) [32])
                                     (lVar51 + (long)(iVar36 * 0x10) * 4 + lVar50 * 4);
                          auVar72 = *(undefined1 (*) [32])(lVar51 + local_738 + lVar50 * 4);
                          auVar73 = *(undefined1 (*) [32])(lVar51 + local_740 + lVar50 * 4);
                          auVar103._0_4_ = auVar12._0_4_ + auVar74._0_4_;
                          auVar103._4_4_ = auVar12._4_4_ + auVar74._4_4_;
                          auVar103._8_4_ = auVar12._8_4_ + auVar74._8_4_;
                          auVar103._12_4_ = auVar12._12_4_ + auVar74._12_4_;
                          auVar103._16_4_ = auVar12._16_4_ + auVar74._16_4_;
                          auVar103._20_4_ = auVar12._20_4_ + auVar74._20_4_;
                          auVar103._24_4_ = auVar12._24_4_ + auVar74._24_4_;
                          auVar103._28_4_ = auVar12._28_4_ + auVar74._28_4_;
                          auVar106._0_4_ = auVar73._0_4_ + auVar72._0_4_;
                          auVar106._4_4_ = auVar73._4_4_ + auVar72._4_4_;
                          auVar106._8_4_ = auVar73._8_4_ + auVar72._8_4_;
                          auVar106._12_4_ = auVar73._12_4_ + auVar72._12_4_;
                          auVar106._16_4_ = auVar73._16_4_ + auVar72._16_4_;
                          auVar106._20_4_ = auVar73._20_4_ + auVar72._20_4_;
                          auVar106._24_4_ = auVar73._24_4_ + auVar72._24_4_;
                          auVar106._28_4_ = auVar73._28_4_ + auVar72._28_4_;
                          auVar74 = vsubps_avx(auVar74,auVar12);
                          auVar12 = vsubps_avx(auVar72,auVar73);
                          pfVar44 = (float *)(lVar51 + lVar50 * 4);
                          auVar97._0_4_ = auVar103._0_4_ + *pfVar44 + auVar106._0_4_;
                          auVar97._4_4_ = auVar103._4_4_ + pfVar44[1] + auVar106._4_4_;
                          auVar97._8_4_ = auVar103._8_4_ + pfVar44[2] + auVar106._8_4_;
                          auVar97._12_4_ = auVar103._12_4_ + pfVar44[3] + auVar106._12_4_;
                          auVar97._16_4_ = auVar103._16_4_ + pfVar44[4] + auVar106._16_4_;
                          auVar97._20_4_ = auVar103._20_4_ + pfVar44[5] + auVar106._20_4_;
                          auVar97._24_4_ = auVar103._24_4_ + pfVar44[6] + auVar106._24_4_;
                          auVar97._28_4_ = auVar103._28_4_ + pfVar44[7] + auVar106._28_4_;
                          auVar72 = vmulps_avx512vl(auVar74,auVar114._0_32_);
                          auVar72 = vfmadd231ps_avx512vl(auVar72,auVar12,auVar115._0_32_);
                          auVar73 = vmulps_avx512vl(auVar103,auVar116._0_32_);
                          auVar74 = vfmadd213ps_avx512vl
                                              (auVar74,auVar118._0_32_,
                                               *(undefined1 (*) [32])
                                                (lVar51 + local_748 + lVar50 * 4));
                          auVar73 = vfmadd231ps_avx512vl(auVar73,auVar106,auVar117._0_32_);
                          auVar74 = vfmadd231ps_avx512vl(auVar74,auVar12,auVar119._0_32_);
                          *(undefined1 (*) [32])((long)local_5c0 + lVar58) = auVar97;
                          *(undefined1 (*) [32])(auStack_500 + lVar58) = auVar72;
                          *(undefined1 (*) [32])(auStack_440 + lVar58) = auVar73;
                          *(undefined1 (*) [32])(auStack_380 + lVar58) = auVar74;
                          lVar51 = lVar51 + local_8d0;
                          lVar58 = lVar58 + 0x20;
                        } while (lVar58 != 0);
                        iVar37 = iVar21 % local_8d4;
                        uVar28 = iVar21 / local_8d4 << 2;
                        pauVar48 = (undefined1 (*) [32])
                                   ((long)local_838->data +
                                   (long)(iVar37 * 4 * iVar20) * 4 +
                                   (long)local_838->w * local_838->elemsize * (long)(int)uVar28 +
                                   local_838->cstep * (long)((iVar46 + (int)local_830) / iVar20) *
                                   local_838->elemsize);
                        iVar38 = iVar37 * 4 + 1;
                        iVar39 = iVar37 * 4 + 2;
                        iVar21 = iVar37 * 4 + 3;
                        pfVar44 = afStack_5e0;
                        lVar51 = 0;
                        do {
                          if ((int)(uVar28 | (uint)lVar51) < iVar57) {
                            auVar74 = *(undefined1 (*) [32])(pfVar44 + -0x20);
                            auVar12 = *(undefined1 (*) [32])(pfVar44 + -0x18);
                            auVar72 = *(undefined1 (*) [32])(pfVar44 + -0x10);
                            auVar73 = *(undefined1 (*) [32])(pfVar44 + -8);
                            auVar93._0_4_ = auVar12._0_4_ + auVar74._0_4_;
                            auVar93._4_4_ = auVar12._4_4_ + auVar74._4_4_;
                            auVar93._8_4_ = auVar12._8_4_ + auVar74._8_4_;
                            auVar93._12_4_ = auVar12._12_4_ + auVar74._12_4_;
                            auVar93._16_4_ = auVar12._16_4_ + auVar74._16_4_;
                            auVar93._20_4_ = auVar12._20_4_ + auVar74._20_4_;
                            auVar93._24_4_ = auVar12._24_4_ + auVar74._24_4_;
                            auVar93._28_4_ = auVar12._28_4_ + auVar74._28_4_;
                            auVar107._0_4_ = auVar73._0_4_ + auVar72._0_4_;
                            auVar107._4_4_ = auVar73._4_4_ + auVar72._4_4_;
                            auVar107._8_4_ = auVar73._8_4_ + auVar72._8_4_;
                            auVar107._12_4_ = auVar73._12_4_ + auVar72._12_4_;
                            auVar107._16_4_ = auVar73._16_4_ + auVar72._16_4_;
                            auVar107._20_4_ = auVar73._20_4_ + auVar72._20_4_;
                            auVar107._24_4_ = auVar73._24_4_ + auVar72._24_4_;
                            auVar107._28_4_ = auVar73._28_4_ + auVar72._28_4_;
                            auVar74 = vsubps_avx(auVar74,auVar12);
                            auVar12 = vsubps_avx(auVar72,auVar73);
                            auVar68._0_4_ =
                                 auVar71._0_4_ + pfVar44[-0x28] + auVar93._0_4_ + auVar107._0_4_;
                            auVar68._4_4_ =
                                 auVar71._4_4_ + pfVar44[-0x27] + auVar93._4_4_ + auVar107._4_4_;
                            auVar68._8_4_ =
                                 auVar71._8_4_ + pfVar44[-0x26] + auVar93._8_4_ + auVar107._8_4_;
                            auVar68._12_4_ =
                                 auVar71._12_4_ + pfVar44[-0x25] + auVar93._12_4_ + auVar107._12_4_;
                            auVar101._16_4_ =
                                 auVar71._16_4_ + pfVar44[-0x24] + auVar93._16_4_ + auVar107._16_4_;
                            auVar101._0_16_ = auVar68;
                            auVar101._20_4_ =
                                 auVar71._20_4_ + pfVar44[-0x23] + auVar93._20_4_ + auVar107._20_4_;
                            auVar101._24_4_ =
                                 auVar71._24_4_ + pfVar44[-0x22] + auVar93._24_4_ + auVar107._24_4_;
                            auVar101._28_4_ =
                                 auVar71._28_4_ + pfVar44[-0x21] + auVar93._28_4_ + auVar107._28_4_;
                            auVar72 = vfmadd231ps_avx512vl(auVar71,auVar74,auVar114._0_32_);
                            auVar73 = vfmadd132ps_avx512vl(auVar93,auVar71,auVar116._0_32_);
                            auVar73 = vfmadd231ps_avx512vl(auVar73,auVar107,auVar117._0_32_);
                            auVar90._0_4_ = auVar71._0_4_ + *pfVar44;
                            auVar90._4_4_ = auVar71._4_4_ + pfVar44[1];
                            auVar90._8_4_ = auVar71._8_4_ + pfVar44[2];
                            auVar90._12_4_ = auVar71._12_4_ + pfVar44[3];
                            auVar90._16_4_ = auVar71._16_4_ + pfVar44[4];
                            auVar90._20_4_ = auVar71._20_4_ + pfVar44[5];
                            auVar90._24_4_ = auVar71._24_4_ + pfVar44[6];
                            auVar90._28_4_ = auVar71._28_4_ + pfVar44[7];
                            auVar72 = vfmadd231ps_avx512vl(auVar72,auVar12,auVar115._0_32_);
                            auVar74 = vfmadd231ps_avx512vl(auVar90,auVar74,auVar118._0_32_);
                            auVar74 = vfmadd231ps_avx512vl(auVar74,auVar12,auVar119._0_32_);
                            auVar94 = auVar101._16_16_;
                            auVar67 = auVar72._16_16_;
                            auVar65 = auVar73._16_16_;
                            auVar88 = auVar74._16_16_;
                            auVar100 = auVar72._0_16_;
                            auVar66 = auVar73._0_16_;
                            auVar64 = auVar74._0_16_;
                            if (iVar20 == 1) {
                              *(float *)*pauVar48 = auVar68._0_4_;
                              uVar13 = vextractps_avx(auVar68,1);
                              *(undefined4 *)(*pauVar48 + lVar22 * 4) = uVar13;
                              uVar13 = vextractps_avx(auVar68,2);
                              *(undefined4 *)(*pauVar48 + (long)local_8c0 * 4) = uVar13;
                              uVar13 = vextractps_avx(auVar68,3);
                              *(undefined4 *)(*pauVar48 + lVar23 * 4) = uVar13;
                              *(float *)(*pauVar48 + lVar24 * 4) = auVar101._16_4_;
                              uVar13 = vextractps_avx(auVar94,1);
                              *(undefined4 *)(*pauVar48 + lVar25 * 4) = uVar13;
                              uVar13 = vextractps_avx(auVar94,2);
                              *(undefined4 *)(*pauVar48 + lVar26 * 4) = uVar13;
                              uVar13 = vextractps_avx(auVar94,3);
                              *(undefined4 *)(*pauVar48 + lVar30 * 4) = uVar13;
                              if (iVar38 < iVar35) {
                                *(int *)(*pauVar48 + 4) = auVar72._0_4_;
                                uVar13 = vextractps_avx(auVar100,1);
                                *(undefined4 *)(*pauVar48 + lVar22 * 4 + 4) = uVar13;
                                uVar13 = vextractps_avx(auVar100,2);
                                *(undefined4 *)(*pauVar48 + (long)local_8c0 * 4 + 4) = uVar13;
                                uVar13 = vextractps_avx(auVar100,3);
                                *(undefined4 *)(*pauVar48 + lVar23 * 4 + 4) = uVar13;
                                *(int *)(*pauVar48 + lVar24 * 4 + 4) = auVar72._16_4_;
                                uVar13 = vextractps_avx(auVar67,1);
                                *(undefined4 *)(*pauVar48 + lVar25 * 4 + 4) = uVar13;
                                uVar13 = vextractps_avx(auVar67,2);
                                *(undefined4 *)(*pauVar48 + lVar26 * 4 + 4) = uVar13;
                                uVar13 = vextractps_avx(auVar67,3);
                                *(undefined4 *)(*pauVar48 + lVar30 * 4 + 4) = uVar13;
                              }
                              if (iVar39 < iVar35) {
                                *(int *)(*pauVar48 + 8) = auVar73._0_4_;
                                uVar13 = vextractps_avx(auVar66,1);
                                *(undefined4 *)(*pauVar48 + lVar22 * 4 + 8) = uVar13;
                                uVar13 = vextractps_avx(auVar66,2);
                                *(undefined4 *)(*pauVar48 + (long)local_8c0 * 4 + 8) = uVar13;
                                uVar13 = vextractps_avx(auVar66,3);
                                *(undefined4 *)(*pauVar48 + lVar23 * 4 + 8) = uVar13;
                                *(int *)(*pauVar48 + lVar24 * 4 + 8) = auVar73._16_4_;
                                uVar13 = vextractps_avx(auVar65,1);
                                *(undefined4 *)(*pauVar48 + lVar25 * 4 + 8) = uVar13;
                                uVar13 = vextractps_avx(auVar65,2);
                                *(undefined4 *)(*pauVar48 + lVar26 * 4 + 8) = uVar13;
                                uVar13 = vextractps_avx(auVar65,3);
                                *(undefined4 *)(*pauVar48 + lVar30 * 4 + 8) = uVar13;
                              }
                              if (iVar21 < iVar35) {
                                *(int *)(*pauVar48 + 0xc) = auVar74._0_4_;
                                uVar13 = vextractps_avx(auVar64,1);
                                *(undefined4 *)(*pauVar48 + lVar22 * 4 + 0xc) = uVar13;
                                uVar13 = vextractps_avx(auVar64,2);
                                *(undefined4 *)(*pauVar48 + (long)local_8c0 * 4 + 0xc) = uVar13;
                                uVar13 = vextractps_avx(auVar64,3);
                                *(undefined4 *)(*pauVar48 + lVar23 * 4 + 0xc) = uVar13;
                                *(int *)(*pauVar48 + lVar24 * 4 + 0xc) = auVar74._16_4_;
                                uVar13 = vextractps_avx(auVar88,1);
                                *(undefined4 *)(*pauVar48 + lVar25 * 4 + 0xc) = uVar13;
                                uVar13 = vextractps_avx(auVar88,2);
                                *(undefined4 *)(*pauVar48 + lVar26 * 4 + 0xc) = uVar13;
                                uVar13 = vextractps_avx(auVar88,3);
                                *(undefined4 *)(*pauVar48 + lVar30 * 4 + 0xc) = uVar13;
                              }
                            }
                            else if (iVar20 == 4) {
                              *(undefined1 (*) [16])*pauVar48 = auVar68;
                              *(undefined1 (*) [16])(*pauVar48 + lVar22 * 4) = auVar94;
                              if (iVar38 < iVar35) {
                                *(undefined1 (*) [16])(*pauVar48 + 0x10) = auVar100;
                                *(undefined1 (*) [16])(*pauVar48 + lVar22 * 4 + 0x10) = auVar67;
                              }
                              if (iVar39 < iVar35) {
                                *(undefined1 (*) [16])pauVar48[1] = auVar66;
                                *(undefined1 (*) [16])(pauVar48[1] + lVar22 * 4) = auVar65;
                              }
                              if (iVar21 < iVar35) {
                                *(undefined1 (*) [16])(pauVar48[1] + 0x10) = auVar64;
                                *(undefined1 (*) [16])(pauVar48[1] + lVar22 * 4 + 0x10) = auVar88;
                              }
                            }
                            else if (iVar20 == 8) {
                              *pauVar48 = auVar101;
                              if (iVar38 < iVar35) {
                                pauVar48[1] = auVar72;
                              }
                              if (iVar39 < iVar35) {
                                pauVar48[2] = auVar73;
                              }
                              if (iVar21 < iVar35) {
                                pauVar48[3] = auVar74;
                              }
                            }
                            pauVar48 = (undefined1 (*) [32])
                                       (*pauVar48 + (long)(iVar20 * iVar35) * 4);
                          }
                          lVar51 = lVar51 + 1;
                          pfVar44 = pfVar44 + 0x30;
                        } while (lVar51 != 4);
                        uVar32 = uVar32 + 1;
                        pvVar34 = (void *)((long)local_8e8 + 0x20);
                      } while (uVar32 != local_8c8);
                    }
                    uVar32 = local_830 + 8;
                    local_840 = CONCAT44(local_840._4_4_,(int)local_840 + iVar36 * 0x120);
                    uVar55 = local_850;
                  } while ((long)(local_830 + 0xf) < local_7e8);
                }
                iVar36 = (int)uVar55;
                uVar28 = iVar36 * 4;
                local_848 = (ulong)uVar28;
                auVar64 = auVar122._0_16_;
                auVar88 = auVar123._0_16_;
                if ((int)((uint)uVar32 | 3) < (int)uVar60) {
                  local_8c0 = (void *)((long)local_8e0 + local_8b8 * 4);
                  lVar23 = (long)(int)(uVar56 * 2);
                  lVar24 = (long)(int)(uVar56 * 3);
                  iVar21 = (uint)uVar32 * iVar36 * 0x24;
                  local_8d0 = CONCAT44(local_8d0._4_4_,iVar36 * 0x90);
                  local_8c8 = (long)(int)uVar28 * 4;
                  local_830 = (long)(iVar36 * 8) * 4;
                  local_840 = (long)(iVar36 * 0xc) * 4;
                  local_810 = (long)(iVar36 * 0x10) * 4;
                  local_818 = (long)(iVar36 * 0x14) * 4;
                  lVar22 = (long)(int)uVar56;
                  local_8e8 = (void *)(uVar55 & 0xffffffff);
                  uVar33 = uVar32 & 0xffffffff;
                  do {
                    if (local_8e0 == (void *)0x0) {
                      auVar66 = (undefined1  [16])0x0;
                    }
                    else {
                      auVar66 = *(undefined1 (*) [16])((long)local_8c0 + uVar33 * 4);
                    }
                    if (0 < (int)uVar55) {
                      lVar25 = (long)iVar21;
                      lVar26 = 0;
                      pvVar34 = (void *)0x0;
                      do {
                        iVar37 = iVar29 + (int)pvVar34;
                        lVar30 = (long)local_7e0.data + lVar26;
                        lVar50 = -0x60;
                        do {
                          auVar65 = *(undefined1 (*) [16])(lVar30 + local_8c8 + lVar25 * 4);
                          auVar100 = *(undefined1 (*) [16])(lVar30 + local_830 + lVar25 * 4);
                          auVar67 = *(undefined1 (*) [16])(lVar30 + local_840 + lVar25 * 4);
                          auVar68 = *(undefined1 (*) [16])(lVar30 + local_810 + lVar25 * 4);
                          auVar69._0_4_ = auVar100._0_4_ + auVar65._0_4_;
                          auVar69._4_4_ = auVar100._4_4_ + auVar65._4_4_;
                          auVar69._8_4_ = auVar100._8_4_ + auVar65._8_4_;
                          auVar69._12_4_ = auVar100._12_4_ + auVar65._12_4_;
                          auVar70._0_4_ = auVar68._0_4_ + auVar67._0_4_;
                          auVar70._4_4_ = auVar68._4_4_ + auVar67._4_4_;
                          auVar70._8_4_ = auVar68._8_4_ + auVar67._8_4_;
                          auVar70._12_4_ = auVar68._12_4_ + auVar67._12_4_;
                          auVar65 = vsubps_avx(auVar65,auVar100);
                          auVar100 = vsubps_avx(auVar67,auVar68);
                          pfVar44 = (float *)(lVar30 + lVar25 * 4);
                          auVar94._0_4_ = auVar69._0_4_ + *pfVar44 + auVar70._0_4_;
                          auVar94._4_4_ = auVar69._4_4_ + pfVar44[1] + auVar70._4_4_;
                          auVar94._8_4_ = auVar69._8_4_ + pfVar44[2] + auVar70._8_4_;
                          auVar94._12_4_ = auVar69._12_4_ + pfVar44[3] + auVar70._12_4_;
                          auVar67 = vmulps_avx512vl(auVar65,auVar120._0_16_);
                          auVar67 = vfmadd231ps_avx512vl(auVar67,auVar100,auVar121._0_16_);
                          auVar68 = vmulps_avx512vl(auVar69,auVar64);
                          auVar65 = vfmadd213ps_fma(auVar65,auVar109._0_16_,
                                                    *(undefined1 (*) [16])
                                                     (lVar30 + local_818 + lVar25 * 4));
                          auVar68 = vfmadd231ps_avx512vl(auVar68,auVar70,auVar88);
                          auVar65 = vfmadd231ps_fma(auVar65,auVar100,auVar110._0_16_);
                          *(undefined1 (*) [16])((long)auStack_620 + lVar50) = auVar94;
                          *(undefined1 (*) [16])((long)local_5c0 + lVar50) = auVar67;
                          *(undefined1 (*) [16])(auStack_560 + lVar50) = auVar68;
                          *(undefined1 (*) [16])(auStack_500 + lVar50) = auVar65;
                          lVar30 = lVar30 + (long)(iVar36 * 0x18) * 4;
                          lVar50 = lVar50 + 0x10;
                        } while (lVar50 != 0);
                        iVar38 = iVar37 % local_8d4;
                        uVar54 = iVar37 / local_8d4 << 2;
                        pauVar53 = (undefined1 (*) [16])
                                   ((long)local_838->data +
                                   (long)(iVar38 * 4 * iVar20) * 4 +
                                   (long)local_838->w * local_838->elemsize * (long)(int)uVar54 +
                                   local_838->cstep * (long)((iVar46 + (int)uVar33) / iVar20) *
                                   local_838->elemsize);
                        iVar37 = iVar38 * 4 + 1;
                        iVar39 = iVar38 * 4 + 2;
                        iVar38 = iVar38 * 4 + 3;
                        pfVar44 = afStack_638 + 2;
                        lVar30 = 0;
                        do {
                          if ((int)(uVar54 | (uint)lVar30) < iVar57) {
                            auVar65 = *(undefined1 (*) [16])(pfVar44 + -0x10);
                            auVar100 = *(undefined1 (*) [16])(pfVar44 + -0xc);
                            auVar67 = *(undefined1 (*) [16])(pfVar44 + -8);
                            auVar68 = *(undefined1 (*) [16])(pfVar44 + -4);
                            auVar89._0_4_ = auVar100._0_4_ + auVar65._0_4_;
                            auVar89._4_4_ = auVar100._4_4_ + auVar65._4_4_;
                            auVar89._8_4_ = auVar100._8_4_ + auVar65._8_4_;
                            auVar89._12_4_ = auVar100._12_4_ + auVar65._12_4_;
                            auVar104._0_4_ = auVar68._0_4_ + auVar67._0_4_;
                            auVar104._4_4_ = auVar68._4_4_ + auVar67._4_4_;
                            auVar104._8_4_ = auVar68._8_4_ + auVar67._8_4_;
                            auVar104._12_4_ = auVar68._12_4_ + auVar67._12_4_;
                            auVar65 = vsubps_avx(auVar65,auVar100);
                            auVar100 = vsubps_avx(auVar67,auVar68);
                            auVar98._0_4_ =
                                 auVar66._0_4_ + pfVar44[-0x14] + auVar89._0_4_ + auVar104._0_4_;
                            auVar98._4_4_ =
                                 auVar66._4_4_ + pfVar44[-0x13] + auVar89._4_4_ + auVar104._4_4_;
                            auVar98._8_4_ =
                                 auVar66._8_4_ + pfVar44[-0x12] + auVar89._8_4_ + auVar104._8_4_;
                            auVar98._12_4_ =
                                 auVar66._12_4_ + pfVar44[-0x11] + auVar89._12_4_ + auVar104._12_4_;
                            auVar67 = vfmadd231ps_avx512vl(auVar66,auVar65,auVar120._0_16_);
                            auVar68 = vfmadd132ps_avx512vl(auVar89,auVar66,auVar64);
                            auVar68 = vfmadd231ps_avx512vl(auVar68,auVar104,auVar88);
                            auVar91._0_4_ = auVar66._0_4_ + *pfVar44;
                            auVar91._4_4_ = auVar66._4_4_ + pfVar44[1];
                            auVar91._8_4_ = auVar66._8_4_ + pfVar44[2];
                            auVar91._12_4_ = auVar66._12_4_ + pfVar44[3];
                            auVar67 = vfmadd231ps_avx512vl(auVar67,auVar100,auVar121._0_16_);
                            auVar65 = vfmadd231ps_fma(auVar91,auVar65,auVar109._0_16_);
                            auVar65 = vfmadd231ps_fma(auVar65,auVar100,auVar110._0_16_);
                            if (iVar20 == 1) {
                              *(float *)*pauVar53 = auVar98._0_4_;
                              uVar13 = vextractps_avx(auVar98,1);
                              *(undefined4 *)(*pauVar53 + lVar22 * 4) = uVar13;
                              uVar13 = vextractps_avx(auVar98,2);
                              *(undefined4 *)(*pauVar53 + lVar23 * 4) = uVar13;
                              uVar13 = vextractps_avx(auVar98,3);
                              *(undefined4 *)(*pauVar53 + lVar24 * 4) = uVar13;
                              if (iVar37 < iVar35) {
                                *(int *)(*pauVar53 + 4) = auVar67._0_4_;
                                uVar13 = vextractps_avx(auVar67,1);
                                *(undefined4 *)(*pauVar53 + lVar22 * 4 + 4) = uVar13;
                                uVar13 = vextractps_avx(auVar67,2);
                                *(undefined4 *)(*pauVar53 + lVar23 * 4 + 4) = uVar13;
                                uVar13 = vextractps_avx(auVar67,3);
                                *(undefined4 *)(*pauVar53 + lVar24 * 4 + 4) = uVar13;
                              }
                              if (iVar39 < iVar35) {
                                *(int *)(*pauVar53 + 8) = auVar68._0_4_;
                                uVar13 = vextractps_avx(auVar68,1);
                                *(undefined4 *)(*pauVar53 + lVar22 * 4 + 8) = uVar13;
                                uVar13 = vextractps_avx(auVar68,2);
                                *(undefined4 *)(*pauVar53 + lVar23 * 4 + 8) = uVar13;
                                uVar13 = vextractps_avx(auVar68,3);
                                *(undefined4 *)(*pauVar53 + lVar24 * 4 + 8) = uVar13;
                              }
                              if (iVar38 < iVar35) {
                                *(int *)(*pauVar53 + 0xc) = auVar65._0_4_;
                                uVar13 = vextractps_avx(auVar65,1);
                                *(undefined4 *)(*pauVar53 + lVar22 * 4 + 0xc) = uVar13;
                                uVar13 = vextractps_avx(auVar65,2);
                                *(undefined4 *)(*pauVar53 + lVar23 * 4 + 0xc) = uVar13;
                                uVar13 = vextractps_avx(auVar65,3);
                                *(undefined4 *)(*pauVar53 + lVar24 * 4 + 0xc) = uVar13;
                              }
                            }
                            else if (iVar20 == 4) {
                              *pauVar53 = auVar98;
                              if (iVar37 < iVar35) {
                                pauVar53[1] = auVar67;
                              }
                              if (iVar39 < iVar35) {
                                pauVar53[2] = auVar68;
                              }
                              if (iVar38 < iVar35) {
                                pauVar53[3] = auVar65;
                              }
                            }
                            pauVar53 = (undefined1 (*) [16])
                                       (*pauVar53 + (long)(iVar20 * iVar35) * 4);
                          }
                          lVar30 = lVar30 + 1;
                          pfVar44 = pfVar44 + 0x18;
                        } while (lVar30 != 4);
                        pvVar34 = (void *)((long)pvVar34 + 1);
                        lVar26 = lVar26 + 0x10;
                      } while (pvVar34 != local_8e8);
                    }
                    uVar32 = uVar33 + 4;
                    lVar25 = uVar33 + 7;
                    iVar21 = iVar21 + iVar36 * 0x90;
                    uVar33 = uVar32;
                    uVar55 = local_850;
                  } while (lVar25 < local_7e8);
                }
                uVar54 = (uint)uVar32;
                uVar33 = uVar55;
                if ((int)(uVar54 | 1) < (int)uVar60) {
                  iVar21 = (int)uVar55;
                  iVar46 = local_838->w;
                  pvVar34 = local_838->data;
                  sVar14 = local_838->elemsize;
                  local_8d0 = local_838->cstep * sVar14;
                  iVar20 = uVar54 * iVar21 * 0x24;
                  local_8e8 = (void *)CONCAT44(local_8e8._4_4_,iVar21 * 0x48);
                  uVar41 = (long)(int)uVar54;
                  do {
                    auVar65 = ZEXT816(0) << 0x40;
                    auVar66 = (undefined1  [16])0x0;
                    if (local_8e0 != (void *)0x0) {
                      auVar66 = ZEXT416(*(uint *)((long)local_8e0 + uVar41 * 4 + local_8b8 * 4));
                      auVar65 = ZEXT416(*(uint *)((long)local_8e0 + uVar41 * 4 + local_8b8 * 4 + 4))
                      ;
                    }
                    if (0 < (int)uVar33) {
                      puVar42 = (undefined8 *)((long)local_7e0.data + (long)iVar20 * 4);
                      uVar32 = 0;
                      do {
                        iVar37 = iVar29 + (int)uVar32;
                        lVar22 = -0x30;
                        puVar43 = puVar42;
                        do {
                          uVar33 = *(ulong *)((long)puVar43 + (long)(iVar21 * 2) * 4);
                          auVar92._8_8_ = 0;
                          auVar92._0_8_ = uVar33;
                          uVar9 = *(ulong *)((long)puVar43 + (long)(int)uVar28 * 4);
                          auVar95._8_8_ = 0;
                          auVar95._0_8_ = uVar9;
                          auVar99._0_4_ = (float)uVar9 + (float)uVar33;
                          auVar99._4_4_ = (float)(uVar9 >> 0x20) + (float)(uVar33 >> 0x20);
                          auVar99._8_8_ = 0;
                          uVar33 = *(ulong *)((long)puVar43 + (long)(iVar21 * 6) * 4);
                          auVar102._8_8_ = 0;
                          auVar102._0_8_ = uVar33;
                          uVar9 = *(ulong *)((long)puVar43 + (long)(iVar21 * 8) * 4);
                          auVar105._8_8_ = 0;
                          auVar105._0_8_ = uVar9;
                          auVar108._0_4_ = (float)uVar9 + (float)uVar33;
                          auVar108._4_4_ = (float)(uVar9 >> 0x20) + (float)(uVar33 >> 0x20);
                          auVar108._8_8_ = 0;
                          auVar100._0_4_ = auVar108._0_4_ + auVar99._0_4_ + (float)*puVar43;
                          auVar100._4_4_ =
                               auVar108._4_4_ + auVar99._4_4_ + (float)((ulong)*puVar43 >> 0x20);
                          auVar100._8_8_ = 0;
                          uVar10 = vmovlps_avx(auVar100);
                          *(undefined8 *)((long)afStack_638 + lVar22 + -0x18) = uVar10;
                          auVar100 = vinsertps_avx(auVar102,auVar92,0x50);
                          auVar67 = vinsertps_avx(auVar105,auVar95,0x50);
                          auVar68 = vsubps_avx(auVar100,auVar67);
                          auVar100 = vinsertps_avx(auVar92,auVar102,0x50);
                          auVar67 = vinsertps_avx(auVar95,auVar105,0x50);
                          auVar100 = vsubps_avx(auVar100,auVar67);
                          auVar67._0_4_ = auVar68._0_4_ * 1.4142135;
                          auVar67._4_4_ = auVar68._4_4_ * 0.70710677;
                          auVar67._8_4_ = auVar68._8_4_ * 0.0;
                          auVar67._12_4_ = auVar68._12_4_ * 0.0;
                          auVar67 = vfmadd231ps_fma(auVar67,auVar100,auVar111._0_16_);
                          uVar10 = vmovlps_avx(auVar67);
                          *(undefined8 *)((long)auStack_620 + lVar22) = uVar10;
                          auVar67 = vmulps_avx512vl(auVar99,auVar64);
                          auVar67 = vfmadd231ps_avx512vl(auVar67,auVar108,auVar88);
                          uVar10 = vmovlps_avx(auVar67);
                          *(undefined8 *)((long)auStack_5f0 + lVar22) = uVar10;
                          auVar96._8_8_ = 0;
                          auVar96._0_8_ = *(ulong *)((long)puVar43 + (long)(iVar21 * 10) * 4);
                          auVar67 = vfmadd231ps_fma(auVar96,auVar68,auVar112._0_16_);
                          auVar100 = vfmadd231ps_fma(auVar67,auVar100,auVar113._0_16_);
                          uVar10 = vmovlps_avx(auVar100);
                          *(undefined8 *)((long)local_5c0 + lVar22) = uVar10;
                          puVar43 = (undefined8 *)((long)puVar43 + (long)(iVar36 * 0xc) * 4);
                          lVar22 = lVar22 + 8;
                        } while (lVar22 != 0);
                        iVar38 = iVar37 % local_8d4;
                        uVar54 = iVar37 / local_8d4 << 2;
                        pfVar44 = (float *)((long)pvVar34 +
                                           (long)(iVar38 * 4) * 4 +
                                           (long)(int)uVar54 * (long)iVar46 * sVar14 +
                                           (local_8b8 + uVar41) * local_8d0);
                        piVar59 = &local_680.w;
                        lVar22 = 0;
                        do {
                          if ((int)(uVar54 | (uint)lVar22) < iVar57) {
                            fVar1 = (float)piVar59[-5];
                            fVar2 = (float)piVar59[-4];
                            fVar3 = (float)piVar59[-3];
                            fVar4 = (float)piVar59[-2];
                            fVar16 = (float)piVar59[-7] + (float)piVar59[-9];
                            fVar17 = (float)piVar59[-6] + (float)piVar59[-8];
                            fVar18 = fVar3 + fVar1;
                            fVar19 = fVar4 + fVar2;
                            fVar5 = (float)piVar59[-10];
                            auVar70 = ZEXT416((uint)((float)piVar59[-9] - (float)piVar59[-7]));
                            auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3eb504f3),0),auVar70,
                                                       auVar66);
                            fVar6 = (float)piVar59[-1];
                            auVar69 = ZEXT416((uint)((float)piVar59[-8] - (float)piVar59[-6]));
                            auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3eb504f3),0),auVar69,auVar65
                                                     );
                            fVar7 = (float)*piVar59;
                            *pfVar44 = auVar66._0_4_ + *(float *)&((Mat *)(piVar59 + -0xb))->data +
                                       fVar16 + fVar18;
                            pfVar44[(int)uVar56] = auVar65._0_4_ + fVar5 + fVar17 + fVar19;
                            auVar94 = ZEXT416((uint)(fVar2 - fVar4));
                            auVar68 = ZEXT416((uint)(fVar1 - fVar3));
                            if (iVar38 * 4 + 1 < iVar35) {
                              auVar69 = vfmadd213ss_avx512f(auVar69,ZEXT416(0x3f3504f3),auVar65);
                              auVar69 = vfmadd231ss_avx512f(auVar69,auVar94,
                                                            SUB6416(ZEXT464(0x3fb504f3),0));
                              auVar70 = vfmadd213ss_avx512f(auVar70,ZEXT416(0x3f3504f3),auVar66);
                              auVar70 = vfmadd231ss_avx512f(auVar70,auVar68,
                                                            SUB6416(ZEXT464(0x3fb504f3),0));
                              pfVar44[1] = auVar70._0_4_;
                              pfVar44[(long)(int)uVar56 + 1] = auVar69._0_4_;
                            }
                            if (iVar38 * 4 + 2 < iVar35) {
                              auVar69 = vfmadd213ss_fma(ZEXT416((uint)fVar16),
                                                        SUB6416(ZEXT464(0x3f000000),0),auVar66);
                              auVar69 = vfmadd213ss_fma(ZEXT416((uint)fVar18),
                                                        SUB6416(ZEXT464(0x40000000),0),auVar69);
                              auVar70 = vfmadd213ss_fma(ZEXT416((uint)fVar17),
                                                        SUB6416(ZEXT464(0x3f000000),0),auVar65);
                              auVar70 = vfmadd213ss_fma(ZEXT416((uint)fVar19),
                                                        SUB6416(ZEXT464(0x40000000),0),auVar70);
                              pfVar44[2] = auVar69._0_4_;
                              pfVar44[(long)(int)uVar56 + 2] = auVar70._0_4_;
                            }
                            auVar109 = ZEXT1664(CONCAT412(0x3eb504f3,
                                                          CONCAT48(0x3eb504f3,0x3eb504f33eb504f3)));
                            auVar110 = ZEXT1664(CONCAT412(0x403504f3,
                                                          CONCAT48(0x403504f3,0x403504f3403504f3)));
                            auVar111 = ZEXT1664(ZEXT816(0x3fb504f33f3504f3));
                            auVar112 = ZEXT1664(ZEXT816(0x3eb504f3403504f3));
                            auVar113 = ZEXT1664(ZEXT816(0x403504f33eb504f3));
                            if (iVar38 * 4 + 3 < iVar35) {
                              auVar100 = vfmadd213ss_fma(auVar68,SUB6416(ZEXT464(0x403504f3),0),
                                                         ZEXT416((uint)(auVar100._0_4_ + fVar6)));
                              auVar67 = vfmadd213ss_fma(auVar94,SUB6416(ZEXT464(0x403504f3),0),
                                                        ZEXT416((uint)(auVar67._0_4_ + fVar7)));
                              pfVar44[3] = auVar100._0_4_;
                              pfVar44[(long)(int)uVar56 + 3] = auVar67._0_4_;
                            }
                            pfVar44 = pfVar44 + iVar35;
                          }
                          lVar22 = lVar22 + 1;
                          piVar59 = piVar59 + 0xc;
                        } while (lVar22 != 4);
                        uVar32 = uVar32 + 1;
                        puVar42 = puVar42 + 1;
                      } while (uVar32 != (uVar55 & 0xffffffff));
                    }
                    uVar32 = uVar41 + 2;
                    lVar22 = uVar41 + 3;
                    iVar20 = iVar20 + iVar21 * 0x48;
                    uVar41 = uVar32;
                    uVar33 = local_850;
                  } while (lVar22 < local_7e8);
                }
                iVar20 = (int)uVar32;
                if (iVar20 < (int)uVar60) {
                  iVar21 = (int)uVar33;
                  iVar46 = local_838->w;
                  local_8e8 = local_838->data;
                  sVar14 = local_838->elemsize;
                  sVar15 = local_838->cstep;
                  lVar22 = (long)iVar20;
                  iVar20 = iVar20 * iVar21 * 0x24;
                  uVar32 = uVar33;
                  do {
                    if (local_8e0 == (void *)0x0) {
                      auVar64 = vxorps_avx512vl(auVar78._0_16_,auVar78._0_16_);
                      auVar78 = ZEXT1664(auVar64);
                    }
                    else {
                      auVar78 = ZEXT464(*(uint *)((long)local_8e0 + lVar22 * 4 + local_8b8 * 4));
                    }
                    if (0 < (int)uVar32) {
                      pfVar44 = (float *)((long)local_7e0.data + (long)iVar20 * 4);
                      uVar32 = 0;
                      do {
                        iVar37 = iVar29 + (int)uVar32;
                        lVar23 = -0x18;
                        pfVar45 = pfVar44;
                        do {
                          fVar1 = pfVar45[iVar21];
                          fVar2 = pfVar45[iVar21 * 2];
                          fVar5 = fVar2 + fVar1;
                          fVar3 = pfVar45[iVar21 * 3];
                          fVar4 = pfVar45[(int)uVar28];
                          fVar6 = fVar4 + fVar3;
                          *(float *)((long)afStack_638 + lVar23 + -0x30) = fVar5 + *pfVar45 + fVar6;
                          auVar88 = ZEXT416((uint)(fVar1 - fVar2));
                          auVar64 = vmulss_avx512f(auVar88,ZEXT416(0x3f3504f3));
                          auVar66 = ZEXT416((uint)(fVar3 - fVar4));
                          auVar64 = vfmadd231ss_avx512f(auVar64,auVar66,ZEXT416(0x3fb504f3));
                          *(int *)((long)afStack_638 + lVar23 + -0x18) = auVar64._0_4_;
                          auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * 0.5)),
                                                    ZEXT416((uint)fVar6),
                                                    SUB6416(ZEXT464(0x40000000),0));
                          *(int *)((long)afStack_638 + lVar23) = auVar64._0_4_;
                          auVar64 = vfmadd213ss_fma(auVar88,SUB6416(ZEXT464(0x3eb504f3),0),
                                                    ZEXT416((uint)pfVar45[iVar21 * 5]));
                          auVar64 = vfmadd231ss_fma(auVar64,auVar66,SUB6416(ZEXT464(0x403504f3),0));
                          *(int *)((long)auStack_620 + lVar23) = auVar64._0_4_;
                          pfVar45 = pfVar45 + iVar21 * 6;
                          lVar23 = lVar23 + 4;
                        } while (lVar23 != 0);
                        iVar38 = iVar37 % local_8d4;
                        uVar56 = iVar37 / local_8d4 << 2;
                        pfVar45 = (float *)((long)local_8e8 +
                                           (long)(iVar38 * 4) * 4 +
                                           (long)(int)uVar56 * (long)iVar46 * sVar14 +
                                           (local_8b8 + lVar22) * sVar15 * sVar14);
                        pfVar49 = (float *)((long)&local_680.elemsize + 4);
                        lVar23 = 0;
                        do {
                          if ((int)(uVar56 | (uint)lVar23) < iVar57) {
                            fVar1 = pfVar49[-3] + pfVar49[-4];
                            fVar2 = pfVar49[-1] + pfVar49[-2];
                            auVar67 = auVar78._0_16_;
                            auVar66 = vaddss_avx512f(auVar67,ZEXT416((uint)pfVar49[-5]));
                            auVar88 = vfmadd132ss_avx512f(ZEXT416((uint)fVar1),auVar67,
                                                          SUB6416(ZEXT464(0x3f000000),0));
                            auVar65 = ZEXT416((uint)(pfVar49[-4] - pfVar49[-3]));
                            auVar64 = vfmadd231ss_fma(auVar67,auVar65,ZEXT416(0x3eb504f3));
                            auVar88 = vfmadd231ss_fma(auVar88,ZEXT416((uint)fVar2),
                                                      SUB6416(ZEXT464(0x40000000),0));
                            auVar100 = ZEXT416((uint)(pfVar49[-2] - pfVar49[-1]));
                            auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ + *pfVar49)),
                                                      auVar100,ZEXT416(0x403504f3));
                            *pfVar45 = auVar66._0_4_ + fVar1 + fVar2;
                            if (iVar38 * 4 + 1 < iVar35) {
                              auVar66 = vfmadd132ss_avx512f(auVar65,auVar67,ZEXT416(0x3f3504f3));
                              auVar66 = vfmadd231ss_fma(auVar66,auVar100,ZEXT416(0x3fb504f3));
                              pfVar45[1] = auVar66._0_4_;
                            }
                            if (iVar38 * 4 + 2 < iVar35) {
                              pfVar45[2] = auVar88._0_4_;
                            }
                            if (iVar38 * 4 + 3 < iVar35) {
                              pfVar45[3] = auVar64._0_4_;
                            }
                            pfVar45 = pfVar45 + iVar35;
                          }
                          lVar23 = lVar23 + 1;
                          pfVar49 = pfVar49 + 6;
                        } while (lVar23 != 4);
                        uVar32 = uVar32 + 1;
                        pfVar44 = pfVar44 + 1;
                      } while (uVar32 != (uVar33 & 0xffffffff));
                    }
                    lVar22 = lVar22 + 1;
                    iVar20 = iVar20 + iVar36 * 0x24;
                    uVar32 = local_850;
                  } while (lVar22 != local_7e8);
                }
                uVar32 = (ulong)(iVar29 + local_8ec);
              } while ((int)(iVar29 + local_8ec) < (int)local_800);
            }
            piVar59 = (int *)CONCAT44(local_7e0.refcount._4_4_,local_7e0.refcount._0_4_);
            if (piVar59 != (int *)0x0) {
              LOCK();
              *piVar59 = *piVar59 + -1;
              UNLOCK();
              if (*piVar59 == 0) {
                if (local_7e0.allocator == (Allocator *)0x0) {
                  if (local_7e0.data != (void *)0x0) {
                    free(local_7e0.data);
                  }
                }
                else {
                  (*(local_7e0.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_7e0.cstep = 0;
            local_7e0.data = (void *)0x0;
            local_7e0.refcount._0_4_ = 0;
            local_7e0.refcount._4_4_ = 0;
            local_7e0.elemsize = 0;
            local_7e0.elempack = 0;
            local_7e0.dims = 0;
            local_7e0.w = 0;
            local_7e0.h = 0;
            local_7e0.d = 0;
            local_7e0.c = 0;
            local_8a8 = local_8a8 + 1;
          } while (local_8a8 != local_804);
        }
        iVar29 = 0;
      }
      piVar59 = (int *)CONCAT44(local_8a0.refcount._4_4_,local_8a0.refcount._0_4_);
      if (piVar59 != (int *)0x0) {
        LOCK();
        *piVar59 = *piVar59 + -1;
        UNLOCK();
        if (*piVar59 == 0) {
          if (local_8a0.allocator == (Allocator *)0x0) {
            if (local_8a0.data != (void *)0x0) {
              free(local_8a0.data);
            }
          }
          else {
            (*(local_8a0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_8a0.cstep = 0;
      local_8a0.data = (void *)0x0;
      local_8a0.refcount._0_4_ = 0;
      local_8a0.refcount._4_4_ = 0;
      local_8a0.elemsize = 0;
      local_8a0.elempack = 0;
      local_8a0.dims = 0;
      local_8a0.w = 0;
      local_8a0.h = 0;
      local_8a0.d = 0;
      local_8a0.c = 0;
      goto LAB_001942d5;
    }
    piVar59 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
    if (piVar59 != (int *)0x0) {
      LOCK();
      *piVar59 = *piVar59 + -1;
      UNLOCK();
      if (*piVar59 == 0) {
        if (local_680.allocator == (Allocator *)0x0) {
LAB_00191bdb:
          if (local_680.data != (void *)0x0) {
            free(local_680.data);
          }
        }
        else {
          (*(local_680.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_680.cstep = 0;
  local_680.data = (void *)0x0;
  local_680.refcount._0_4_ = 0;
  local_680.refcount._4_4_ = 0;
  local_680.elemsize = 0;
  local_680.elempack = 0;
  local_680.dims = 0;
  local_680.w = 0;
  local_680.h = 0;
  local_680.d = 0;
  local_680.c = 0;
LAB_001942d5:
  piVar59 = (int *)CONCAT44(local_790.refcount._4_4_,local_790.refcount._0_4_);
  if (piVar59 != (int *)0x0) {
    LOCK();
    *piVar59 = *piVar59 + -1;
    UNLOCK();
    if (*piVar59 == 0) {
      if (local_790.allocator == (Allocator *)0x0) {
        if (local_790.data != (void *)0x0) {
          free(local_790.data);
        }
      }
      else {
        (*(local_790.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar29;
}

Assistant:

static int conv3x3s1_winograd43(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 4n+2, winograd F(4,3)
    int w_tiles = (outw + 3) / 4;
    int h_tiles = (outh + 3) / 4;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 36;

    // NCNN_LOGE("conv3x3s1_winograd43 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);
        if (B_tile.empty())
            return -100;

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd43_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);
        if (B_tileX.empty())
            return -100;

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd43_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (top_tileX.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd43_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }

    return 0;
}